

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

int stmm_foreach(stmm_table *table,_func_stmm_retval_char_ptr_char_ptr_char_ptr *func,char *arg)

{
  stmm_table_entry *pEntry;
  stmm_retval sVar1;
  stmm_table_entry **ppsVar2;
  long lVar3;
  
  lVar3 = 0;
LAB_003db1ab:
  if (table->num_bins <= lVar3) {
    return 1;
  }
  ppsVar2 = table->bins + lVar3;
LAB_003db1c2:
  do {
    pEntry = *ppsVar2;
    do {
      if (pEntry == (stmm_table_entry *)0x0) {
        lVar3 = lVar3 + 1;
        goto LAB_003db1ab;
      }
      sVar1 = (*func)(pEntry->key,pEntry->record,arg);
      if (sVar1 == STMM_DELETE) {
        *ppsVar2 = pEntry->next;
        table->num_entries = table->num_entries + -1;
        Extra_MmFixedEntryRecycle((Extra_MmFixed_t *)table->pMemMan,(char *)pEntry);
        goto LAB_003db1c2;
      }
      if (sVar1 == STMM_STOP) {
        return 0;
      }
    } while (sVar1 != STMM_CONTINUE);
    ppsVar2 = &pEntry->next;
  } while( true );
}

Assistant:

int
stmm_foreach (stmm_table *table, enum stmm_retval (*func) (char *, char *, char *), char *arg)
{
    stmm_table_entry *ptr, **last;
    enum stmm_retval retval;
    int i;

    for (i = 0; i < table->num_bins; i++) {
    last = &table->bins[i];
    ptr = *last;
    while (ptr != NULL) {
        retval = (*func) (ptr->key, ptr->record, arg);
        switch (retval) {
        case STMM_CONTINUE:
        last = &ptr->next;
        ptr = *last;
        break;
        case STMM_STOP:
        return 0;
        case STMM_DELETE:
        *last = ptr->next;
        table->num_entries--;   /* cstevens@ic */
//                              ABC_FREE( ptr );
        Extra_MmFixedEntryRecycle ((Extra_MmFixed_t *)table->pMemMan, (char *) ptr);

        ptr = *last;
        }
    }
    }
    return 1;
}